

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise3d.cpp
# Opt level: O0

void __thiscall
ncnn::DeconvolutionDepthWise3D::cut_padding
          (DeconvolutionDepthWise3D *this,Mat *top_blob_bordered,Mat *top_blob,Option *opt)

{
  int *piVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Mat *in_RDI;
  int dcut;
  int hcut;
  int wcut;
  int iVar2;
  int left;
  int bottom;
  int top;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  Option *in_stack_fffffffffffffff0;
  
  left = (int)((ulong)in_RDX >> 0x20);
  top = (int)((ulong)in_RSI >> 0x20);
  iVar2 = (int)in_RDX;
  bottom = (int)in_RSI;
  if ((((*(int *)&in_RDI[3].allocator < 1) && (*(int *)((long)&in_RDI[3].allocator + 4) < 1)) &&
      (in_RDI[3].dims < 1)) && (((in_RDI[3].w < 1 && (in_RDI[3].h < 1)) && (in_RDI[3].d < 1)))) {
    if (((*(int *)((long)&in_RDI[3].cstep + 4) < 1) || (*(int *)&in_RDI[4].data < 1)) ||
       (*(int *)((long)&in_RDI[4].data + 4) < 1)) {
      if (in_RDX != in_RSI) {
        if (in_RSI[1] != 0) {
          LOCK();
          *(int *)in_RSI[1] = *(int *)in_RSI[1] + 1;
          UNLOCK();
        }
        if (in_RDX[1] != 0) {
          piVar1 = (int *)in_RDX[1];
          LOCK();
          iVar2 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (iVar2 == 1) {
            if (in_RDX[4] == 0) {
              if ((void *)*in_RDX != (void *)0x0) {
                free((void *)*in_RDX);
              }
            }
            else {
              (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
            }
          }
        }
        *in_RDX = 0;
        in_RDX[2] = 0;
        *(undefined4 *)(in_RDX + 3) = 0;
        *(undefined4 *)(in_RDX + 5) = 0;
        *(undefined4 *)((long)in_RDX + 0x2c) = 0;
        *(undefined4 *)(in_RDX + 6) = 0;
        *(undefined4 *)((long)in_RDX + 0x34) = 0;
        *(undefined4 *)(in_RDX + 7) = 0;
        in_RDX[8] = 0;
        in_RDX[1] = 0;
        *in_RDX = *in_RSI;
        in_RDX[1] = in_RSI[1];
        in_RDX[2] = in_RSI[2];
        *(undefined4 *)(in_RDX + 3) = *(undefined4 *)(in_RSI + 3);
        in_RDX[4] = in_RSI[4];
        *(undefined4 *)(in_RDX + 5) = *(undefined4 *)(in_RSI + 5);
        *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)in_RSI + 0x2c);
        *(undefined4 *)(in_RDX + 6) = *(undefined4 *)(in_RSI + 6);
        *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)in_RSI + 0x34);
        *(undefined4 *)(in_RDX + 7) = *(undefined4 *)(in_RSI + 7);
        in_RDX[8] = in_RSI[8];
      }
    }
    else if (((((*(int *)&in_RDI[3].allocator == -0xe9) ||
               (*(int *)((long)&in_RDI[3].allocator + 4) == -0xe9)) || (in_RDI[3].dims == -0xe9)) ||
             ((in_RDI[3].w == -0xe9 || (in_RDI[3].h == -0xe9)))) || (in_RDI[3].d == -0xe9)) {
      copy_cut_border_3d((Mat *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI
                         ,top,bottom,left,iVar2,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,
                         in_stack_fffffffffffffff0);
    }
    else if (((*(int *)&in_RDI[3].allocator == -0xea) ||
             (*(int *)((long)&in_RDI[3].allocator + 4) == -0xea)) ||
            ((in_RDI[3].dims == -0xea ||
             (((in_RDI[3].w == -0xea || (in_RDI[3].h == -0xea)) || (in_RDI[3].d == -0xea)))))) {
      copy_cut_border_3d((Mat *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI
                         ,top,bottom,left,iVar2,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,
                         in_stack_fffffffffffffff0);
    }
  }
  else {
    copy_cut_border_3d((Mat *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI,
                       top,bottom,left,iVar2,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,
                       in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

void DeconvolutionDepthWise3D::cut_padding(const Mat& top_blob_bordered, Mat& top_blob, const Option& opt) const
{
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || pad_front > 0 || pad_behind > 0)
    {
        copy_cut_border_3d(top_blob_bordered, top_blob, pad_top, pad_bottom, pad_left, pad_right, pad_front, pad_behind, opt);
    }
    else if (output_w > 0 && output_h > 0 && output_d > 0)
    {
        int wcut = top_blob_bordered.w - output_w;
        int hcut = top_blob_bordered.h - output_h;
        int dcut = top_blob_bordered.d - output_d;

        if (pad_left == -233 || pad_right == -233 || pad_top == -233 || pad_bottom == -233 || pad_front == -233 || pad_behind == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border_3d(top_blob_bordered, top_blob, hcut / 2, hcut - hcut / 2, wcut / 2, wcut - wcut / 2, dcut / 2, dcut - dcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234 || pad_top == -234 || pad_bottom == -234 || pad_front == -234 || pad_behind == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border_3d(top_blob_bordered, top_blob, hcut - hcut / 2, hcut / 2, wcut - wcut / 2, wcut / 2, dcut - dcut / 2, dcut / 2, opt);
        }
    }
    else
    {
        top_blob = top_blob_bordered;
    }
}